

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ons_test.cc
# Opt level: O0

int test_ons_message_push(void)

{
  code *pcVar1;
  char *__s;
  Ons *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1e9;
  int ret;
  HttpTestListener *local_1c8;
  HttpTestListener *listener;
  string local_1b8;
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [55];
  allocator<char> local_131;
  string local_130 [32];
  Ons *local_110;
  Ons *ons;
  OnsOnsMessagePushResponseType resp;
  OnsOnsMessagePushRequestType req;
  
  aliyun::OnsOnsMessagePushRequestType::OnsOnsMessagePushRequestType
            ((OnsOnsMessagePushRequestType *)((long)&resp.help_url.field_2 + 8));
  aliyun::OnsOnsMessagePushResponseType::OnsOnsMessagePushResponseType
            ((OnsOnsMessagePushResponseType *)&ons);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"cn-hangzhou",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168,"my_appid",&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"my_secret",&local_191);
  pOVar2 = (Ons *)aliyun::Ons::CreateOnsClient(local_130,local_168,local_190);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  local_110 = pOVar2;
  if (pOVar2 == (Ons *)0x0) {
    aliyun::OnsOnsMessagePushResponseType::~OnsOnsMessagePushResponseType
              ((OnsOnsMessagePushResponseType *)&ons);
    aliyun::OnsOnsMessagePushRequestType::~OnsOnsMessagePushRequestType
              ((OnsOnsMessagePushRequestType *)((long)&resp.help_url.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Ons::SetProxyHost(pOVar2,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Ons::SetUseTls(local_110,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_ons_message_push_response;
  local_1c8 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1e9);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1e9);
  HttpTestListener::Start(local_1c8);
  std::__cxx11::string::operator=((string *)(resp.help_url.field_2._M_local_buf + 8),"OnsRegionId");
  std::__cxx11::string::operator=
            ((string *)(req.ons_region_id.field_2._M_local_buf + 8),"OnsPlatform");
  std::__cxx11::string::operator=
            ((string *)(req.ons_platform.field_2._M_local_buf + 8),"PreventCache");
  std::__cxx11::string::operator=
            ((string *)(req.prevent_cache.field_2._M_local_buf + 8),"ConsumerId");
  std::__cxx11::string::operator=((string *)(req.consumer_id.field_2._M_local_buf + 8),"ClientId");
  std::__cxx11::string::operator=((string *)(req.client_id.field_2._M_local_buf + 8),"MsgId");
  std::__cxx11::string::operator=((string *)(req.msg_id.field_2._M_local_buf + 8),"Topic");
  aliyun::Ons::OnsMessagePush
            (local_110,(OnsOnsMessagePushRequestType *)((long)&resp.help_url.field_2 + 8),
             (OnsOnsMessagePushResponseType *)&ons,(OnsErrorInfo *)0x0);
  HttpTestListener::WaitComplete(local_1c8);
  pHVar3 = local_1c8;
  if (local_1c8 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_1c8);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_110;
  if (local_110 != (Ons *)0x0) {
    aliyun::Ons::~Ons(local_110);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_ons_message_push() {
  OnsOnsMessagePushRequestType req;
  OnsOnsMessagePushResponseType resp;
  Ons* ons = Ons::CreateOnsClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ons) return 0;
  ons->SetProxyHost("127.0.0.1:12234");
  ons->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_ons_message_push_response);
  listener->Start();
  req.ons_region_id = "OnsRegionId";
  req.ons_platform = "OnsPlatform";
  req.prevent_cache = "PreventCache";
  req.consumer_id = "ConsumerId";
  req.client_id = "ClientId";
  req.msg_id = "MsgId";
  req.topic = "Topic";
  int ret = ons->OnsMessagePush(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ons;
}